

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O3

int __thiscall MPEGStreamReader::readPacket(MPEGStreamReader *this,AVPacket *avPacket)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  long lVar9;
  byte bVar10;
  ulong uVar11;
  
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->flags = (this->super_AbstractStreamReader).m_flags;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0xd])();
  avPacket->codecID = *(int *)CONCAT44(extraout_var,iVar3);
  avPacket->duration = 0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  lVar9 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar9;
  lVar1 = this->m_curDts;
  lVar2 = this->m_pcrIncPerFrame;
  iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar9 + lVar1) - iVar3 * lVar2;
  puVar7 = (this->super_AbstractStreamReader).m_curPos;
  puVar6 = (this->super_AbstractStreamReader).m_bufEnd;
  puVar5 = puVar7;
  if (this->m_syncToStream == false) {
    puVar5 = NALUnit::findNALWithStartCode(puVar7,puVar6,this->m_longCodesAllowed);
    puVar6 = (this->super_AbstractStreamReader).m_bufEnd;
    if (puVar5 == puVar6) {
      bVar10 = this->m_syncToStream;
      puVar5 = puVar6;
    }
    else {
      this->m_syncToStream = true;
      bVar10 = 1;
    }
    (this->super_AbstractStreamReader).m_curPos = puVar5;
    this->m_processedBytes = this->m_processedBytes + (long)((int)puVar5 - (int)puVar7);
    if ((bVar10 & 1) == 0) {
      return 1;
    }
  }
  puVar7 = puVar5 + 3;
  if (puVar6 < puVar5 + 3) {
    puVar7 = puVar6;
  }
  puVar6 = NALUnit::findNALWithStartCode(puVar7,puVar6,this->m_longCodesAllowed);
  puVar7 = (this->super_AbstractStreamReader).m_bufEnd;
  if (puVar6 == puVar7) {
    storeBufferRest(this);
    return 1;
  }
  uVar4 = bufFromNAL(this);
  if (uVar4 == 0) {
    uVar11 = 0;
  }
  else {
    puVar7 = (this->super_AbstractStreamReader).m_curPos;
    lVar9 = this->m_curDts;
    this->m_shortStartCodes = uVar4 < 4;
    while( true ) {
      uVar11 = (ulong)uVar4;
      iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x1f])(this,puVar7 + uVar11);
      if (iVar3 != 5) break;
      puVar7 = NALUnit::findNALWithStartCode
                         ((this->super_AbstractStreamReader).m_curPos + uVar11,
                          (this->super_AbstractStreamReader).m_bufEnd,this->m_longCodesAllowed);
      this->m_processedBytes =
           (int64_t)(puVar7 + (this->m_processedBytes -
                              (long)(this->super_AbstractStreamReader).m_curPos));
      (this->super_AbstractStreamReader).m_curPos = puVar7;
      if (puVar7 == (this->super_AbstractStreamReader).m_bufEnd) {
        this->m_syncToStream = false;
        goto LAB_001bd0c8;
      }
      uVar4 = bufFromNAL(this);
      puVar5 = puVar7;
    }
    if (iVar3 == -10) {
LAB_001bd0c8:
      storeBufferRest(this);
      this->m_lastDecodedPos = (uint8_t *)0x0;
      return 1;
    }
    lVar1 = this->m_curDts;
    if (lVar9 != lVar1) {
      lVar9 = (this->super_AbstractStreamReader).m_timeOffset;
      avPacket->pts = this->m_curPts + lVar9;
      lVar2 = this->m_pcrIncPerFrame;
      iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x17])(this);
      avPacket->dts = (lVar1 + lVar9) - iVar3 * lVar2;
      iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x1c])(this);
      if ((char)iVar3 != '\0') {
        *(byte *)&avPacket->flags = (byte)avPacket->flags | 8;
      }
      iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                _vptr_BaseAbstractStreamReader[0x11])(this,avPacket);
      if ((char)iVar3 != '\0') {
        *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x10;
      }
      if (this->m_spsPpsFound == true) {
        *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x20;
        return 0;
      }
      return 0;
    }
    puVar7 = (this->super_AbstractStreamReader).m_bufEnd;
  }
  puVar8 = (this->super_AbstractStreamReader).m_curPos;
  puVar6 = puVar8 + 0x8000;
  if (puVar6 < puVar7) {
    puVar7 = puVar6;
  }
  puVar8 = NALUnit::findNALWithStartCode(puVar8 + uVar11,puVar7,this->m_longCodesAllowed);
  puVar6 = puVar8;
  if (puVar8 == puVar7) {
    if (*puVar8 == '\0') {
      if (puVar8[-1] != '\0') goto LAB_001bd02a;
      puVar7 = puVar8 + -1;
      lVar9 = -2;
    }
    else {
      if (((*puVar8 != '\x01') || (puVar8[-1] != '\0')) || (puVar8[-2] != '\0')) goto LAB_001bd02a;
      puVar7 = puVar8 + -2;
      lVar9 = -3;
    }
    puVar6 = puVar8 + lVar9;
    if (puVar8[lVar9] != '\0') {
      puVar6 = puVar7;
    }
  }
LAB_001bd02a:
  avPacket->data = (this->super_AbstractStreamReader).m_curPos;
  avPacket->size = (int)puVar6 - (int)puVar5;
  lVar9 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar9;
  lVar1 = this->m_curDts;
  lVar2 = this->m_pcrIncPerFrame;
  iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar9 + lVar1) - iVar3 * lVar2;
  iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x1c])(this);
  if ((char)iVar3 != '\0') {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 8;
  }
  iVar3 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x11])(this,avPacket);
  if ((char)iVar3 != '\0') {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x10;
  }
  if (this->m_spsPpsFound == true) {
    *(byte *)&avPacket->flags = (byte)avPacket->flags | 0x20;
  }
  (this->super_AbstractStreamReader).m_curPos = puVar6;
  (this->super_AbstractStreamReader).m_tmpBufferLen = 0;
  this->m_processedBytes = this->m_processedBytes + (long)avPacket->size;
  return 0;
}

Assistant:

int MPEGStreamReader::readPacket(AVPacket& avPacket)
{
    // LTRACE(LT_DEBUG, 0, "MPEGStreamReader::readPacket");
    avPacket.codec = this;
    avPacket.flags = m_flags;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;

    avPacket.duration = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    const uint8_t* prevPos = m_curPos;
    if (!m_syncToStream)
    {
        uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos, m_bufEnd, m_longCodesAllowed);
        if (nal != m_bufEnd)
        {
            m_syncToStream = true;
            m_curPos = nal;
        }
        else
            m_curPos = m_bufEnd;
        const int bytesProcessed = static_cast<int>(m_curPos - prevPos);
        m_processedBytes += bytesProcessed;
        prevPos = m_curPos;
        if (!m_syncToStream)
            return NEED_MORE_DATA;
    }

    const uint8_t* nextNal =
        NALUnit::findNALWithStartCode((std::min)(m_curPos + 3, m_bufEnd), m_bufEnd, m_longCodesAllowed);
    if (nextNal == m_bufEnd)
    {
        storeBufferRest();
        return NEED_MORE_DATA;
    }

    int isNal = bufFromNAL();
    if (isNal)
    {
        const int64_t prevDts = m_curDts;
        m_shortStartCodes = isNal < 4;
        int rez;
        while (true)
        {
            rez = decodeNal(m_curPos + isNal);
            if (rez != UNIT_SKIPPED)
                break;
            uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, m_bufEnd, m_longCodesAllowed);
            // assert(nal < findEnd); // if unit is skipped, next unit MUST be in buffer

            m_processedBytes += nal - m_curPos;
            prevPos = m_curPos = nal;
            if (nal == m_bufEnd)
            {
                rez = NOT_ENOUGH_BUFFER;
                m_syncToStream = false;
                break;
            }
            isNal = bufFromNAL();
        }

        if (rez == NOT_ENOUGH_BUFFER)
        {
            storeBufferRest();
            m_lastDecodedPos = nullptr;
            return NEED_MORE_DATA;
        }
        if (prevDts != m_curDts)
        {
            // stream interleaving is allowed during one stream packet

            avPacket.pts = m_curPts + m_timeOffset;
            avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back to 1 frame;
            if (isIFrame())
                avPacket.flags |= AVPacket::IS_IFRAME;
            if (isPriorityData(&avPacket))
                avPacket.flags |= AVPacket::PRIORITY_DATA;
            if (m_spsPpsFound)
                avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

            return 0;  // return zero AV packet for new frame
        }
    }
    uint8_t* findEnd = (std::min)(m_bufEnd, m_curPos + MAX_AV_PACKET_SIZE);
    uint8_t* nal = NALUnit::findNALWithStartCode(m_curPos + isNal, findEnd, m_longCodesAllowed);

    if (nal == findEnd)
    {
        if (nal[0] == 1 && nal[-1] == 0 && nal[-2] == 0)
        {
            nal -= 2;
            if (nal[-1] == 0)
                nal--;
        }
        else if (nal[0] == 0 && nal[-1] == 0)
        {
            nal--;
            if (nal[-1] == 0)
                nal--;
        }
    }

    const int bytesProcessed = static_cast<int>(nal - prevPos);
    avPacket.data = m_curPos;
    avPacket.size = bytesProcessed;
    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back
    if (isIFrame())
        avPacket.flags |= AVPacket::IS_IFRAME;
    if (isPriorityData(&avPacket))
        avPacket.flags |= AVPacket::PRIORITY_DATA;
    if (m_spsPpsFound)
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

    m_curPos = nal;

    m_tmpBufferLen = 0;
    m_processedBytes += avPacket.size;

    return 0;
}